

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZTensor<double>,_3>::TPZManVector
          (TPZManVector<TPZTensor<double>,_3> *this,TPZManVector<TPZTensor<double>,_3> *copy)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  TPZTensor<double> *pTVar5;
  TPZTensor<double> *pTVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  (this->super_TPZVec<TPZTensor<double>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTensor<double>_>).fStore = (TPZTensor<double> *)0x0;
  (this->super_TPZVec<TPZTensor<double>_>).fNElements = 0;
  (this->super_TPZVec<TPZTensor<double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016ad038;
  pTVar6 = this->fExtAlloc;
  lVar7 = 0;
  pTVar5 = pTVar6;
  do {
    TPZTensor<double>::TPZTensor(pTVar5);
    lVar7 = lVar7 + -0x58;
    pTVar5 = pTVar5 + 1;
  } while (lVar7 != -0x108);
  uVar1 = (copy->super_TPZVec<TPZTensor<double>_>).fNElements;
  if ((long)uVar1 < 4) {
    uVar8 = 0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar3 = SUB168(auVar2 * ZEXT816(0x58),0);
    uVar8 = uVar3 + 8;
    if (0xfffffffffffffff7 < uVar3) {
      uVar8 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x58),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar8);
    *puVar4 = uVar1;
    pTVar6 = (TPZTensor<double> *)(puVar4 + 1);
    lVar7 = 0;
    pTVar5 = pTVar6;
    do {
      TPZTensor<double>::TPZTensor(pTVar5);
      lVar7 = lVar7 + -0x58;
      pTVar5 = pTVar5 + 1;
      uVar8 = uVar1;
    } while (uVar1 * -0x58 - lVar7 != 0);
  }
  (this->super_TPZVec<TPZTensor<double>_>).fStore = pTVar6;
  (this->super_TPZVec<TPZTensor<double>_>).fNElements = uVar1;
  (this->super_TPZVec<TPZTensor<double>_>).fNAlloc = uVar8;
  uVar8 = 0;
  if (0 < (long)uVar1) {
    uVar8 = uVar1;
  }
  lVar7 = 8;
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    TPZManVector<double,_6>::operator=
              ((TPZManVector<double,_6> *)
               ((long)(((this->super_TPZVec<TPZTensor<double>_>).fStore)->fData).fExtAlloc +
               lVar7 + -0x28),
               (TPZManVector<double,_6> *)
               ((long)(((copy->super_TPZVec<TPZTensor<double>_>).fStore)->fData).fExtAlloc +
               lVar7 + -0x28));
    lVar7 = lVar7 + 0x58;
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}